

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O3

SampledSpectrum __thiscall pbrt::Vertex::f(Vertex *this,Vertex *next,TransportMode mode)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ulong uVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  SampledSpectrum SVar13;
  Vector3f wiRender;
  
  auVar7 = vinsertps_avx(*(undefined1 (*) [16])&next->field_2,
                         ZEXT416((uint)(next->field_2).ei.super_Interaction.pi.
                                       super_Point3<pbrt::Interval>.
                                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),0x10);
  auVar12 = vinsertps_avx(*(undefined1 (*) [16])&this->field_2,
                          ZEXT416((uint)(this->field_2).ei.super_Interaction.pi.
                                        super_Point3<pbrt::Interval>.
                                        super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),0x10);
  fVar4 = ((next->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
           super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
          (next->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5 -
          ((this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
           super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
          (this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5;
  uVar1 = *(undefined8 *)
           &(next->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
  uVar2 = *(undefined8 *)
           &(this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
  auVar6._0_4_ = ((float)uVar1 + auVar7._0_4_) * 0.5;
  auVar6._4_4_ = ((float)((ulong)uVar1 >> 0x20) + auVar7._4_4_) * 0.5;
  auVar6._8_4_ = (auVar7._8_4_ + 0.0) * 0.5;
  auVar6._12_4_ = (auVar7._12_4_ + 0.0) * 0.5;
  auVar9._0_4_ = ((float)uVar2 + auVar12._0_4_) * 0.5;
  auVar9._4_4_ = ((float)((ulong)uVar2 >> 0x20) + auVar12._4_4_) * 0.5;
  auVar9._8_4_ = (auVar12._8_4_ + 0.0) * 0.5;
  auVar9._12_4_ = (auVar12._12_4_ + 0.0) * 0.5;
  auVar12 = vsubps_avx(auVar6,auVar9);
  auVar7._0_4_ = auVar12._0_4_ * auVar12._0_4_;
  auVar7._4_4_ = auVar12._4_4_ * auVar12._4_4_;
  auVar7._8_4_ = auVar12._8_4_ * auVar12._8_4_;
  auVar7._12_4_ = auVar12._12_4_ * auVar12._12_4_;
  auVar7 = vhaddps_avx(auVar7,auVar7);
  fVar5 = auVar7._0_4_ + fVar4 * fVar4;
  SVar13.values.values = (array<float,_4>)(ZEXT416(0) << 0x20);
  if ((fVar5 != 0.0) || (NAN(fVar5))) {
    auVar7 = vsqrtss_avx(ZEXT416((uint)fVar5),ZEXT416((uint)fVar5));
    fVar5 = auVar7._0_4_;
    auVar10._4_4_ = fVar5;
    auVar10._0_4_ = fVar5;
    auVar10._8_4_ = fVar5;
    auVar10._12_4_ = fVar5;
    auVar11._0_4_ = fVar4 / fVar5;
    auVar11._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar7 = vdivps_avx(auVar12,auVar10);
    if (this->type == Medium) {
      uVar3._0_4_ = (((Interaction *)&this->field_2)->wo).super_Tuple3<pbrt::Vector3,_float>.x;
      uVar3._4_4_ = (((Interaction *)&this->field_2)->wo).super_Tuple3<pbrt::Vector3,_float>.y;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar3;
      fVar5 = *(float *)((ulong)(this->field_2).ei.field_0 & 0xffffffffffff);
      auVar12._0_4_ = auVar7._0_4_ * (float)(undefined4)uVar3;
      auVar12._4_4_ = auVar7._4_4_ * (float)uVar3._4_4_;
      auVar12._8_4_ = auVar7._8_4_ * 0.0;
      auVar12._12_4_ = auVar7._12_4_ * 0.0;
      auVar12 = vmovshdup_avx(auVar12);
      auVar7 = vfmadd231ss_fma(auVar12,auVar8,auVar7);
      auVar7 = vfmadd132ss_fma(auVar11,auVar7,
                               ZEXT416((uint)(this->field_2).ei.super_Interaction.wo.
                                             super_Tuple3<pbrt::Vector3,_float>.z));
      auVar6 = vfnmadd213ss_fma(ZEXT416((uint)fVar5),ZEXT416((uint)fVar5),
                                SUB6416(ZEXT464(0x3f800000),0));
      auVar12 = vfmadd213ss_fma(ZEXT416((uint)fVar5),ZEXT416((uint)fVar5),
                                SUB6416(ZEXT464(0x3f800000),0));
      auVar12 = vfmadd231ss_fma(auVar12,ZEXT416((uint)(fVar5 + fVar5)),auVar7);
      auVar7 = vmaxss_avx(auVar12,ZEXT816(0) << 0x20);
      auVar7 = vsqrtss_avx(auVar7,auVar7);
      fVar5 = (auVar6._0_4_ * 0.07957747) / (auVar12._0_4_ * auVar7._0_4_);
      SVar13.values.values[2] = fVar5;
      SVar13.values.values[3] = fVar5;
      SVar13.values.values[0] = fVar5;
      SVar13.values.values[1] = fVar5;
    }
    else {
      if (this->type != Surface) {
        LogFatal(Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/integrators.cpp"
                 ,0x662,"Vertex::f(): Unimplemented");
      }
      wiRender.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar7._0_8_;
      wiRender.super_Tuple3<pbrt::Vector3,_float>.z = auVar11._0_4_;
      SVar13 = BSDF::f(&this->bsdf,
                       (Vector3f)*(Tuple3<pbrt::Vector3,_float> *)((long)&this->field_2 + 0x1c),
                       wiRender,mode);
    }
  }
  return (array<float,_4>)(array<float,_4>)SVar13;
}

Assistant:

SampledSpectrum f(const Vertex &next, TransportMode mode) const {
        Vector3f wi = next.p() - p();
        if (LengthSquared(wi) == 0)
            return {};
        wi = Normalize(wi);
        switch (type) {
        case VertexType::Surface:
            return bsdf.f(si.wo, wi, mode);
        case VertexType::Medium:
            return SampledSpectrum(mi.phase.p(mi.wo, wi));
        default:
            LOG_FATAL("Vertex::f(): Unimplemented");
            return SampledSpectrum(0.f);
        }
    }